

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XYZFormat.cpp
# Opt level: O3

bool __thiscall OpenMD::XYZFormat::ReadMolecule(XYZFormat *this,istream *ifs)

{
  pointer *pppXVar1;
  iterator __position;
  char *pcVar2;
  double dVar3;
  char cVar4;
  char *pcVar5;
  _Alloc_hider _Var6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  XYZFormat *this_00;
  int iVar8;
  int iVar9;
  long *plVar10;
  size_t sVar11;
  ulong uVar12;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var13;
  long lVar14;
  ostream *poVar15;
  bool bVar16;
  uint uVar17;
  undefined1 auVar18 [16];
  uint natoms;
  XYZAtom *atom;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vs;
  char *endptr;
  string readTitle;
  StringTokenizer tokenizer;
  stringstream errorMsg;
  char buffer [32768];
  uint local_82a4;
  XYZAtom *local_82a0;
  string local_8298;
  char *local_8278;
  string local_8270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_8250;
  ulong local_8248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8240;
  XYZFormat *local_8230;
  double local_8228;
  double local_8220;
  StringTokenizer local_8218;
  stringstream local_81c0 [16];
  ostream local_81b0 [112];
  ios_base local_8140 [264];
  char local_8038 [32776];
  
  std::__cxx11::stringstream::stringstream(local_81c0);
  if (((&ifs->field_0x20)[(long)ifs->_vptr_basic_istream[-3]] & 5) == 0) {
    cVar4 = (char)ifs;
    std::ios::widen((char)ifs->_vptr_basic_istream[-3] + cVar4);
    plVar10 = (long *)std::istream::getline((char *)ifs,(long)local_8038,'\0');
    if ((*(byte *)((long)plVar10 + *(long *)(*plVar10 + -0x18) + 0x20) & 5) != 0) {
      builtin_strncpy(painCave.errMsg + 0x30,"rst line.\n",0xb);
      builtin_strncpy(painCave.errMsg + 0x20,"nnot read the fi",0x10);
      builtin_strncpy(painCave.errMsg + 0x10," an XYZ file: Ca",0x10);
      builtin_strncpy(painCave.errMsg,"Problems reading",0x10);
      painCave.isFatal = 1;
      simError();
    }
    iVar8 = __isoc99_sscanf(local_8038,"%d",&local_82a4);
    if (iVar8 == 0 || local_82a4 == 0) {
      memcpy(&painCave,
             "Problems reading an XYZ file: The first line must contain the number of atoms.\n",0x50
            );
      painCave.isFatal = 1;
      simError();
    }
    std::vector<OpenMD::XYZAtom_*,_std::allocator<OpenMD::XYZAtom_*>_>::reserve
              (&this->mol_,(ulong)local_82a4);
    std::ios::widen((char)ifs->_vptr_basic_istream[-3] + cVar4);
    plVar10 = (long *)std::istream::getline((char *)ifs,(long)local_8038,'\0');
    if ((*(byte *)((long)plVar10 + *(long *)(*plVar10 + -0x18) + 0x20) & 5) != 0) {
      memcpy(&painCave,
             "Problems reading an XYZ file: Could not read the second line (title/comments).\n",0x50
            );
      painCave.isFatal = 1;
      simError();
    }
    local_8250 = &local_8240;
    sVar11 = strlen(local_8038);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_8250,local_8038,local_8038 + sVar11);
    uVar12 = std::__cxx11::string::find((char *)&local_8250,0x202ee2,0);
    if (uVar12 != 0xffffffffffffffff) {
      if (local_8248 < uVar12) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",
                   uVar12);
      }
      local_8250->_M_local_buf[uVar12] = '\0';
      local_8248 = uVar12;
    }
    std::locale::locale((locale *)&local_82a0);
    paVar7 = local_8250;
    _Var13 = std::
             __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<OpenMD::Utils::trimLeft(std::__cxx11::string&,std::locale_const&)::_lambda(auto:1)_1_>>
                       (local_8250,local_8250->_M_local_buf + local_8248,(locale *)&local_82a0);
    uVar12 = (long)paVar7 - (long)local_8250;
    if (local_8250->_M_local_buf + local_8248 == _Var13._M_current) {
      local_8250->_M_local_buf[uVar12] = '\0';
      local_8248 = uVar12;
    }
    else {
      std::__cxx11::string::_M_erase((ulong)&local_8250,uVar12);
    }
    local_8218.tokenString_._M_dataplus._M_p = local_8250->_M_local_buf + local_8248;
    local_8270._M_dataplus._M_p = (pointer)local_8250;
    std::
    __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<OpenMD::Utils::trimRight(std::__cxx11::string&,std::locale_const&)::_lambda(auto:1)_1_>>
              (&local_8298,&local_8218,&local_8270,&local_82a0);
    local_8248 = (long)local_8298._M_dataplus._M_p - (long)local_8250;
    *local_8298._M_dataplus._M_p = '\0';
    std::locale::~locale((locale *)&local_82a0);
    lVar14 = std::__cxx11::string::find_first_not_of((char *)&local_8250,0x1fb61f,0);
    if (lVar14 == -1) {
      std::__cxx11::string::_M_replace
                ((ulong)&this->title_,0,(char *)(this->title_)._M_string_length,0x205f8a);
    }
    else {
      std::__cxx11::string::_M_assign((string *)&this->title_);
    }
    if (local_82a4 != 0) {
      iVar8 = 3;
      local_8230 = this;
      do {
        this_00 = local_8230;
        std::ios::widen((char)ifs->_vptr_basic_istream[-3] + cVar4);
        plVar10 = (long *)std::istream::getline((char *)ifs,(long)local_8038,'\0');
        if ((*(byte *)((long)plVar10 + *(long *)(*plVar10 + -0x18) + 0x20) & 5) != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_81b0,"Problems reading an XYZ file: ",0x1e);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_81b0,"Could not read line #",0x15);
          poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)local_81b0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,", file error.\n",0xe);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar15," According to line one, there should be ",0x28);
          poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15," atoms, and therefore ",0x16);
          poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15," lines in the file.",0x13);
          std::__cxx11::stringbuf::str();
          _Var6._M_p = local_8218.tokenString_._M_dataplus._M_p;
          strcpy(painCave.errMsg,local_8218.tokenString_._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var6._M_p != &local_8218.tokenString_.field_2) {
            operator_delete(_Var6._M_p,local_8218.tokenString_.field_2._M_allocated_capacity + 1);
          }
          painCave.isFatal = 0;
          painCave.severity = 2;
          simError();
LAB_001b3b5b:
          bVar16 = false;
          goto LAB_001b3b5d;
        }
        local_8270._M_dataplus._M_p = (pointer)&local_8270.field_2;
        sVar11 = strlen(local_8038);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_8270,local_8038,local_8038 + sVar11);
        local_8298._M_dataplus._M_p = (pointer)&local_8298.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_8298," ;,\t\n\r","");
        StringTokenizer::StringTokenizer(&local_8218,&local_8270,&local_8298);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8298._M_dataplus._M_p != &local_8298.field_2) {
          operator_delete(local_8298._M_dataplus._M_p,local_8298.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8270._M_dataplus._M_p != &local_8270.field_2) {
          operator_delete(local_8270._M_dataplus._M_p,local_8270.field_2._M_allocated_capacity + 1);
        }
        StringTokenizer::getAllTokens_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_8298,&local_8218);
        if (local_8298._M_string_length - (long)local_8298._M_dataplus._M_p < 0x80) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_81b0,"Problems reading an XYZ file: ",0x1e);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_81b0,"Could not read line #",0x15);
          poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)local_81b0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,".\n",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar15,"OpenBabel found the line \'",0x1a);
          sVar11 = strlen(local_8038);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,local_8038,sVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\'\n",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar15,
                     "According to the specifications, this line should contain exactly 4 entries, separated by white space.\n"
                     ,0x67);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar15,"However, OpenBabel found ",0x19);
          poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15," items.",7);
          std::__cxx11::stringbuf::str();
          _Var6._M_p = local_8270._M_dataplus._M_p;
          strcpy(painCave.errMsg,local_8270._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var6._M_p != &local_8270.field_2) {
            operator_delete(_Var6._M_p,local_8270.field_2._M_allocated_capacity + 1);
          }
          painCave.isFatal = 0;
          painCave.severity = 2;
          simError();
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_8298);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_8218.delim_._M_dataplus._M_p != &local_8218.delim_.field_2) {
            operator_delete(local_8218.delim_._M_dataplus._M_p,
                            local_8218.delim_.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_8218.tokenString_._M_dataplus._M_p != &local_8218.tokenString_.field_2) {
            operator_delete(local_8218.tokenString_._M_dataplus._M_p,
                            local_8218.tokenString_.field_2._M_allocated_capacity + 1);
          }
          goto LAB_001b3b5b;
        }
        local_82a0 = (XYZAtom *)operator_new(0x48);
        (local_82a0->pos).super_Vector<double,_3U>.data_[2] = 0.0;
        (local_82a0->type)._M_dataplus._M_p = (pointer)0x0;
        (local_82a0->type)._M_string_length = 0;
        (local_82a0->type).field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&(local_82a0->type).field_2 + 8) = 0;
        *(undefined8 *)&local_82a0->atomicNum = 0;
        (local_82a0->pos).super_Vector<double,_3U>.data_[0] = 0.0;
        (local_82a0->pos).super_Vector<double,_3U>.data_[1] = 0.0;
        local_82a0->charge = 0.0;
        (local_82a0->type)._M_dataplus._M_p = (pointer)&(local_82a0->type).field_2;
        (local_82a0->type).field_2._M_local_buf[0] = '\0';
        __position._M_current =
             (this_00->mol_).
             super__Vector_base<OpenMD::XYZAtom_*,_std::allocator<OpenMD::XYZAtom_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this_00->mol_).
            super__Vector_base<OpenMD::XYZAtom_*,_std::allocator<OpenMD::XYZAtom_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<OpenMD::XYZAtom*,std::allocator<OpenMD::XYZAtom*>>::
          _M_realloc_insert<OpenMD::XYZAtom*const&>
                    ((vector<OpenMD::XYZAtom*,std::allocator<OpenMD::XYZAtom*>> *)this_00,__position
                     ,&local_82a0);
        }
        else {
          *__position._M_current = local_82a0;
          pppXVar1 = &(this_00->mol_).
                      super__Vector_base<OpenMD::XYZAtom_*,_std::allocator<OpenMD::XYZAtom_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppXVar1 = *pppXVar1 + 1;
        }
        iVar9 = ElementsTable::GetAtomicNum
                          ((ElementsTable *)etab,*(char **)local_8298._M_dataplus._M_p);
        if (iVar9 == 0) {
          iVar9 = atoi(*(char **)local_8298._M_dataplus._M_p);
          local_82a0->atomicNum = iVar9;
          if (iVar9 == 0) {
            std::__cxx11::string::_M_assign((string *)&local_82a0->type);
          }
        }
        else {
          local_82a0->atomicNum = iVar9;
        }
        local_8220 = strtod(*(char **)(local_8298._M_dataplus._M_p + 0x20),&local_8278);
        if (local_8278 == *(char **)(local_8298._M_dataplus._M_p + 0x20)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_81b0,"Problems reading an XYZ file: ",0x1e);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_81b0,"Could not read line #",0x15);
          poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)local_81b0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,".\n",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar15,"OpenBabel found the line \'",0x1a);
          sVar11 = strlen(local_8038);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,local_8038,sVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\'\n",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar15,
                     "According to the specifications, this line should contain exactly 4 entries, separated by white space.\n"
                     ,0x67);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar15,"OpenBabel could not interpret item #1 as a number.",0x32);
          std::__cxx11::stringbuf::str();
          _Var6._M_p = local_8270._M_dataplus._M_p;
          strcpy(painCave.errMsg,local_8270._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var6._M_p != &local_8270.field_2) {
            operator_delete(_Var6._M_p,local_8270.field_2._M_allocated_capacity + 1);
          }
          painCave.isFatal = 1;
          simError();
        }
        local_8228 = strtod(*(char **)(local_8298._M_dataplus._M_p + 0x40),&local_8278);
        if (local_8278 == *(char **)(local_8298._M_dataplus._M_p + 0x40)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_81b0,"Problems reading an XYZ file: ",0x1e);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_81b0,"Could not read line #",0x15);
          poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)local_81b0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,".\n",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar15,"OpenBabel found the line \'",0x1a);
          sVar11 = strlen(local_8038);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,local_8038,sVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\'\n",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar15,
                     "According to the specifications, this line should contain exactly 4 entries, separated by white space.\n"
                     ,0x67);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar15,"OpenBabel could not interpret item #2 as a number.",0x32);
          std::__cxx11::stringbuf::str();
          _Var6._M_p = local_8270._M_dataplus._M_p;
          strcpy(painCave.errMsg,local_8270._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var6._M_p != &local_8270.field_2) {
            operator_delete(_Var6._M_p,local_8270.field_2._M_allocated_capacity + 1);
          }
          painCave.isFatal = 1;
          simError();
        }
        dVar3 = strtod(*(char **)(local_8298._M_dataplus._M_p + 0x60),&local_8278);
        pcVar5 = local_8278;
        pcVar2 = *(char **)(local_8298._M_dataplus._M_p + 0x60);
        if (local_8278 == pcVar2) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_81b0,"Problems reading an XYZ file: ",0x1e);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_81b0,"Could not read line #",0x15);
          poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)local_81b0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,".\n",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar15,"OpenBabel found the line \'",0x1a);
          sVar11 = strlen(local_8038);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,local_8038,sVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\'\n",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar15,
                     "According to the specifications, this line should contain exactly 4 entries, separated by white space.\n"
                     ,0x67);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar15,"OpenBabel could not interpret item #3 as a number.",0x32);
          std::__cxx11::stringbuf::str();
          _Var6._M_p = local_8270._M_dataplus._M_p;
          strcpy(painCave.errMsg,local_8270._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var6._M_p != &local_8270.field_2) {
            operator_delete(_Var6._M_p,local_8270.field_2._M_allocated_capacity + 1);
          }
          painCave.isFatal = 0;
          painCave.severity = 2;
          simError();
        }
        else {
          (local_82a0->pos).super_Vector<double,_3U>.data_[0] = local_8220;
          (local_82a0->pos).super_Vector<double,_3U>.data_[1] = local_8228;
          (local_82a0->pos).super_Vector<double,_3U>.data_[2] = dVar3;
          if (((0xa0 < local_8298._M_string_length - (long)local_8298._M_dataplus._M_p) &&
              (lVar14 = std::__cxx11::string::find((char)local_8298._M_dataplus._M_p + -0x80,0x2e),
              lVar14 != -1)) &&
             (dVar3 = strtod(*(char **)(local_8298._M_dataplus._M_p + 0x80),&local_8278),
             local_8278 != *(char **)(local_8298._M_dataplus._M_p + 0x80))) {
            local_82a0->charge = dVar3;
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_8298);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8218.delim_._M_dataplus._M_p != &local_8218.delim_.field_2) {
          operator_delete(local_8218.delim_._M_dataplus._M_p,
                          local_8218.delim_.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8218.tokenString_._M_dataplus._M_p != &local_8218.tokenString_.field_2) {
          operator_delete(local_8218.tokenString_._M_dataplus._M_p,
                          local_8218.tokenString_.field_2._M_allocated_capacity + 1);
        }
        if (pcVar5 == pcVar2) goto LAB_001b3b5b;
        uVar17 = iVar8 - 1;
        iVar8 = iVar8 + 1;
      } while (uVar17 <= local_82a4);
    }
    do {
      auVar18 = std::istream::tellg();
      std::ios::widen((char)ifs->_vptr_basic_istream[-3] + cVar4);
      std::istream::getline((char *)ifs,(long)local_8038,'\0');
      if (local_8038[0] != '\0') break;
    } while (((&ifs->field_0x20)[(long)ifs->_vptr_basic_istream[-3]] & 2) == 0);
    bVar16 = true;
    std::istream::seekg(ifs,auVar18._0_8_,auVar18._8_8_);
LAB_001b3b5d:
    if (local_8250 != &local_8240) {
      operator_delete(local_8250,local_8240._M_allocated_capacity + 1);
    }
  }
  else {
    bVar16 = false;
  }
  std::__cxx11::stringstream::~stringstream(local_81c0);
  std::ios_base::~ios_base(local_8140);
  return bVar16;
}

Assistant:

bool XYZFormat::ReadMolecule(std::istream& ifs) {
    char buffer[BUFF_SIZE];
    unsigned int natoms;
    std::stringstream errorMsg;

    if (!ifs)
      return false;  // we're attempting to read past the end of the file

    if (!ifs.getline(buffer, BUFF_SIZE)) {
      strcpy(painCave.errMsg,
             "Problems reading an XYZ file: Cannot read the first line.\n");
      painCave.isFatal = 1;
      simError();
    }

    if (sscanf(buffer, "%d", &natoms) == 0 || !natoms) {
      strcpy(painCave.errMsg, "Problems reading an XYZ file: The first line "
                              "must contain the number of atoms.\n");
      painCave.isFatal = 1;
      simError();
    }

    mol_.reserve(natoms);

    // The next line contains a title string for the molecule. Use this
    // as the title for the molecule if the line is not
    // empty. Otherwise, use the title given by the calling function.
    if (!ifs.getline(buffer, BUFF_SIZE)) {
      strcpy(painCave.errMsg, "Problems reading an XYZ file: Could not read "
                              "the second line (title/comments).\n");
      painCave.isFatal = 1;
      simError();
    }
    std::string readTitle(buffer);
    std::string::size_type location = readTitle.find("Energy");
    if (location != std::string::npos) readTitle.erase(location);
    Utils::trim(readTitle);

    location = readTitle.find_first_not_of(" \t\n\r");
    if (location != std::string::npos)
      title_ = readTitle;
    else
      title_ = "";

    // The next lines contain four items each, separated by white
    // spaces: the atom type, and the coordinates of the atom
    for (unsigned int i = 1; i <= natoms; i++) {
      if (!ifs.getline(buffer, BUFF_SIZE)) {
        errorMsg << "Problems reading an XYZ file: "
                 << "Could not read line #" << i + 2 << ", file error.\n"
                 << " According to line one, there should be " << natoms
                 << " atoms, and therefore " << natoms + 2
                 << " lines in the file.";

        strcpy(painCave.errMsg, errorMsg.str().c_str());
        painCave.isFatal  = 0;
        painCave.severity = OPENMD_WARNING;
        simError();
        return (false);
      }
      StringTokenizer tokenizer(buffer, " ;,\t\n\r");
      std::vector<std::string> vs = tokenizer.getAllTokens();
      if (vs.size() < 4)  // ignore extra columns which some applications add
      {
        errorMsg << "Problems reading an XYZ file: "
                 << "Could not read line #" << i + 2 << ".\n"
                 << "OpenBabel found the line '" << buffer << "'\n"
                 << "According to the specifications, this line should contain "
                    "exactly 4 entries, separated by white space.\n"
                 << "However, OpenBabel found " << vs.size() << " items.";

        strcpy(painCave.errMsg, errorMsg.str().c_str());
        painCave.isFatal  = 0;
        painCave.severity = OPENMD_WARNING;
        simError();
        return (false);
      }

      // Atom Type: get the atomic number from the element table, using
      // the first entry in the currently read line. If the entry makes
      // sense, set the atomic number and leave the atomic type open
      // (the type is then later faulted in when atom->GetType() is
      // called). If the entry does not make sense to use, set the atom
      // type manually, assuming that the author of the xyz-file had
      // something "special" in mind.

      XYZAtom* atom = new XYZAtom();
      mol_.push_back(atom);

      int atomicNum = etab.GetAtomicNum(vs[0].c_str());
      // set atomic number, or '0' if the atom type is not recognized
      if (atomicNum == 0) {
        // Sometimes people call this an XYZ file, but it's actually Unichem
        // i.e., the first column is the atomic number, not a symbol
        // so we'll first check if we can convert this to an element number
        atomicNum = atoi(vs[0].c_str());
      }

      atom->atomicNum = atomicNum;
      if (atomicNum == 0)  // still strange, try using an atom type
        atom->type = vs[0];

      // Read the atom coordinates
      char* endptr;
      double x = strtod((char*)vs[1].c_str(), &endptr);
      if (endptr == (char*)vs[1].c_str()) {
        errorMsg << "Problems reading an XYZ file: "
                 << "Could not read line #" << i + 2 << ".\n"
                 << "OpenBabel found the line '" << buffer << "'\n"
                 << "According to the specifications, this line should contain "
                    "exactly 4 entries, separated by white space.\n"
                 << "OpenBabel could not interpret item #1 as a number.";

        strcpy(painCave.errMsg, errorMsg.str().c_str());
        painCave.isFatal = 1;
        simError();
      }
      double y = strtod((char*)vs[2].c_str(), &endptr);
      if (endptr == (char*)vs[2].c_str()) {
        errorMsg << "Problems reading an XYZ file: "
                 << "Could not read line #" << i + 2 << ".\n"
                 << "OpenBabel found the line '" << buffer << "'\n"
                 << "According to the specifications, this line should contain "
                    "exactly 4 entries, separated by white space.\n"
                 << "OpenBabel could not interpret item #2 as a number.";

        strcpy(painCave.errMsg, errorMsg.str().c_str());
        painCave.isFatal = 1;
        simError();
      }
      double z = strtod((char*)vs[3].c_str(), &endptr);
      if (endptr == (char*)vs[3].c_str()) {
        errorMsg << "Problems reading an XYZ file: "
                 << "Could not read line #" << i + 2 << ".\n"
                 << "OpenBabel found the line '" << buffer << "'\n"
                 << "According to the specifications, this line should contain "
                    "exactly 4 entries, separated by white space.\n"
                 << "OpenBabel could not interpret item #3 as a number.";

        strcpy(painCave.errMsg, errorMsg.str().c_str());
        painCave.isFatal  = 0;
        painCave.severity = OPENMD_WARNING;
        simError();
        return (false);
      }
      atom->pos = Vector3d(x, y, z);  // set coordinates

      // OK, sometimes there's sym x y z charge -- accepted by Jmol
      if (vs.size() > 5) {
        std::string::size_type decimal = vs[4].find('.');
        if (decimal != std::string::npos) {  // period found
          double charge = strtod((char*)vs[4].c_str(), &endptr);
          if (endptr != (char*)vs[4].c_str()) atom->charge = charge;
        }
      }  // attempt to parse charges
    }

    // clean out any remaining blank lines
    std::streampos ipos;
    do {
      ipos = ifs.tellg();
      ifs.getline(buffer, BUFF_SIZE);
    } while (strlen(buffer) == 0 && !ifs.eof());
    ifs.seekg(ipos);
    return (true);
  }